

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::TryDecimalStringCast<long,(char)46>
               (char *string_ptr,idx_t string_size,long *result,uint8_t width,uint8_t scale)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  idx_t iVar10;
  ExponentData exponent;
  DecimalCastData<long> local_58;
  ulong local_40;
  long *local_38;
  
  local_58.result = 0;
  local_58.digit_count = '\0';
  local_58.decimal_count = '\0';
  local_58.round_set = false;
  local_58.should_round = false;
  local_58.excessive_decimals = '\0';
  local_58.exponent_type = NONE;
  local_58.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  uVar9 = 0;
  while( true ) {
    uVar6 = string_size - uVar9;
    if (uVar6 == 0) {
      return false;
    }
    bVar2 = string_ptr[uVar9];
    if ((4 < bVar2 - 9) && (bVar2 != 0x20)) break;
    uVar9 = uVar9 + 1;
  }
  local_58.width = width;
  local_58.scale = scale;
  local_38 = result;
  if (bVar2 == 0x2d) {
    uVar7 = string_size - uVar9;
    uVar6 = 1;
    while (uVar4 = uVar6, uVar4 < uVar7) {
      bVar2 = string_ptr[uVar9 + uVar4];
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 != 0x2e) goto LAB_018a824a;
        uVar6 = uVar4 + 1;
        uVar3 = uVar6;
        goto LAB_018a80c6;
      }
      bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<long>,true>
                        (&local_58,bVar2 - 0x30);
      if ((!bVar1) ||
         (((uVar6 = uVar7, ~uVar4 + string_size != uVar9 &&
           (uVar6 = uVar4 + 1, string_ptr[uVar9 + 1 + uVar4] == '_')) &&
          (((string_size - uVar4) - 2 == uVar9 ||
           (uVar6 = uVar4 + 2, 9 < (byte)(string_ptr[uVar9 + 2 + uVar4] - 0x30U))))))) {
        return false;
      }
    }
LAB_018a8090:
    bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_58);
    if (!bVar1) {
      return false;
    }
    if (uVar4 < 2) {
      return false;
    }
    goto LAB_018a8192;
  }
  if (bVar2 == 0x30 && string_size - 1 != uVar9) {
    bVar1 = (bool)string_ptr[uVar9 + 1];
    if (bVar1 == true) {
LAB_018a814e:
      if ((string_size - uVar9) - 3 < 0xfffffffffffffffe) {
        return false;
      }
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
      return false;
    }
    if (bVar1 != true) {
      if (bVar1 == true) goto LAB_018a814e;
      if (bVar1 != true) goto LAB_018a8001;
    }
    bVar1 = IntegerHexCastLoop<duckdb::DecimalCastData<long>,false,false,duckdb::DecimalCastOperation>
                      (string_ptr + uVar9 + 1,~uVar9 + string_size,&local_58,bVar1);
LAB_018a7ff4:
    if (bVar1 == false) {
      return false;
    }
  }
  else {
LAB_018a8001:
    uVar4 = (ulong)(bVar2 == 0x2b);
    uVar7 = uVar4;
    while (uVar3 = uVar7, uVar7 = uVar3, uVar3 < uVar6) {
      bVar2 = string_ptr[uVar9 + uVar3];
      if (9 < (byte)(bVar2 - 0x30)) {
        if (bVar2 != 0x2e) goto LAB_018a82a1;
        local_40 = uVar3 + 1;
        uVar5 = local_40;
        goto LAB_018a81b4;
      }
      bVar1 = DecimalCastOperation::HandleDigit<duckdb::DecimalCastData<long>,false>
                        (&local_58,bVar2 - 0x30);
      if (!bVar1) {
        return false;
      }
      uVar7 = uVar6;
      if ((~uVar3 + string_size != uVar9) &&
         (uVar7 = uVar3 + 1, string_ptr[uVar9 + 1 + uVar3] == '_')) {
        if ((string_size - uVar3) - 2 == uVar9) {
          return false;
        }
        uVar7 = uVar3 + 2;
        if (9 < (byte)(string_ptr[uVar9 + 2 + uVar3] - 0x30U)) {
          return false;
        }
      }
    }
LAB_018a8179:
    bVar1 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
    if (!bVar1) {
      return false;
    }
    if (uVar7 <= uVar4) {
      return false;
    }
  }
LAB_018a8192:
  *local_38 = local_58.result;
  return true;
LAB_018a80c6:
  uVar5 = uVar3;
  if (uVar5 < uVar7) {
    bVar2 = string_ptr[uVar9 + uVar5];
    if ((byte)(bVar2 - 0x30) < 10) goto code_r0x018a80eb;
    bVar1 = uVar4 < 2;
    uVar4 = uVar5;
    if (uVar5 <= uVar6 && bVar1) {
      return false;
    }
LAB_018a824a:
    if (bVar2 - 9 < 5) {
LAB_018a8259:
      uVar6 = uVar4 + 1;
      uVar4 = uVar6;
      if (uVar6 < uVar7) {
        uVar4 = uVar7;
      }
      for (; uVar6 < uVar7; uVar6 = uVar6 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar9 + uVar6]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar9 + uVar6] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_018a8090;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_018a8259;
    }
    if (uVar4 == 1) {
      return false;
    }
    if (uVar7 <= uVar4 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar8 = string_ptr + uVar9 + uVar4 + 1;
    iVar10 = ~uVar9 + (string_size - uVar4);
    bVar1 = SUB41(bVar2 - 9,0);
    if (*pcVar8 == '-') {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar10,&exponent,bVar1);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar10,&exponent,bVar1);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                      (&local_58,(int)exponent.result);
    goto LAB_018a7ff4;
  }
  bVar1 = uVar4 < 2;
  uVar4 = uVar5;
  if (uVar5 <= uVar6 && bVar1) {
    return false;
  }
  goto LAB_018a8090;
code_r0x018a80eb:
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<long>,true,true>
                    (&local_58,bVar2 - 0x30);
  if (!bVar1) {
    return false;
  }
  uVar3 = uVar7;
  if ((~uVar5 + string_size != uVar9) && (uVar3 = uVar5 + 1, string_ptr[uVar9 + 1 + uVar5] == '_'))
  {
    if ((string_size - uVar5) - 2 == uVar9) {
      return false;
    }
    uVar3 = uVar5 + 2;
    if (9 < (byte)(string_ptr[uVar9 + 2 + uVar5] - 0x30U)) {
      return false;
    }
  }
  goto LAB_018a80c6;
LAB_018a81b4:
  uVar7 = uVar5;
  if (uVar7 < uVar6) {
    bVar2 = string_ptr[uVar9 + uVar7];
    if ((byte)(bVar2 - 0x30) < 10) goto code_r0x018a81d9;
    bVar1 = uVar3 <= uVar4;
    uVar3 = uVar7;
    if (uVar7 <= local_40 && bVar1) {
      return false;
    }
LAB_018a82a1:
    if (bVar2 - 9 < 5) {
LAB_018a82ac:
      uVar3 = uVar3 + 1;
      uVar7 = uVar3;
      if (uVar3 < uVar6) {
        uVar7 = uVar6;
      }
      for (; uVar3 < uVar6; uVar3 = uVar3 + 1) {
        if (0x20 < (ulong)(byte)string_ptr[uVar9 + uVar3]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)string_ptr[uVar9 + uVar3] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_018a8179;
    }
    if ((bVar2 != 0x65) && (bVar2 != 0x45)) {
      if (bVar2 != 0x20) {
        return false;
      }
      goto LAB_018a82ac;
    }
    if (uVar3 == uVar4) {
      return false;
    }
    if (uVar6 <= uVar3 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar8 = string_ptr + uVar9 + uVar3 + 1;
    iVar10 = ~uVar9 + (string_size - uVar3);
    bVar1 = SUB41(bVar2 - 9,0);
    if (*pcVar8 == '-') {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar10,&exponent,bVar1);
    }
    else {
      bVar1 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar8,iVar10,&exponent,bVar1);
    }
    if (bVar1 == false) {
      return false;
    }
    bVar1 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                      (&local_58,(int)exponent.result);
    goto LAB_018a7ff4;
  }
  if (uVar7 <= local_40 && uVar3 <= uVar4) {
    return false;
  }
  goto LAB_018a8179;
code_r0x018a81d9:
  bVar1 = DecimalCastOperation::HandleDecimal<duckdb::DecimalCastData<long>,false,true>
                    (&local_58,bVar2 - 0x30);
  if (!bVar1) {
    return false;
  }
  uVar5 = uVar6;
  if ((~uVar7 + string_size != uVar9) && (uVar5 = uVar7 + 1, string_ptr[uVar9 + 1 + uVar7] == '_'))
  {
    if ((string_size - uVar7) - 2 == uVar9) {
      return false;
    }
    uVar5 = uVar7 + 2;
    if (9 < (byte)(string_ptr[uVar9 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_018a81b4;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}